

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient2d(double *pa,double *pb,double *pc)

{
  double dVar1;
  double dVar2;
  double errbound;
  double detsum;
  double det;
  double detright;
  double detleft;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar1 = (*pa - *pc) * (pb[1] - pc[1]);
  dVar2 = (pa[1] - pc[1]) * (*pb - *pc);
  pa_local = (double *)(dVar1 - dVar2);
  if (dVar1 <= 0.0) {
    if (0.0 <= dVar1) {
      return (double)pa_local;
    }
    if (0.0 <= dVar2) {
      return (double)pa_local;
    }
    errbound = -dVar1 - dVar2;
  }
  else {
    if (dVar2 <= 0.0) {
      return (double)pa_local;
    }
    errbound = dVar1 + dVar2;
  }
  if (((double)pa_local < ccwerrboundA * errbound) && (-(double)pa_local < ccwerrboundA * errbound))
  {
    pa_local = (double *)orient2dadapt(pa,pb,pc,errbound);
  }
  return (double)pa_local;
}

Assistant:

REAL orient2d(REAL *pa, REAL *pb, REAL *pc)
{
  REAL detleft, detright, det;
  REAL detsum, errbound;

  detleft = (pa[0] - pc[0]) * (pb[1] - pc[1]);
  detright = (pa[1] - pc[1]) * (pb[0] - pc[0]);
  det = detleft - detright;

  if (detleft > 0.0) {
    if (detright <= 0.0) {
      return det;
    } else {
      detsum = detleft + detright;
    }
  } else if (detleft < 0.0) {
    if (detright >= 0.0) {
      return det;
    } else {
      detsum = -detleft - detright;
    }
  } else {
    return det;
  }

  errbound = ccwerrboundA * detsum;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return orient2dadapt(pa, pb, pc, detsum);
}